

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

RenderableBatch * __thiscall nite::Batch::draw(Batch *this,float x,float y,float angle)

{
  Color *this_00;
  Rect *this_01;
  float fVar1;
  float fVar2;
  RenderableBatch *object;
  float fVar3;
  Vec2 local_58;
  Color *local_50;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  if (this->objectId < 0) {
    return (RenderableBatch *)0x0;
  }
  local_38 = (this->size).x;
  fVar1 = (this->region).w;
  if ((fVar1 != local_38) || (NAN(fVar1) || NAN(local_38))) {
    fVar3 = (this->region).h;
  }
  else {
    local_34 = (this->size).y;
    fVar3 = (this->region).h;
    if ((fVar3 == local_34) && (!NAN(fVar3) && !NAN(local_34))) goto LAB_0017afc8;
  }
  local_34 = fVar3;
  local_38 = fVar1;
LAB_0017afc8:
  local_44 = angle;
  local_40 = y;
  local_3c = x;
  object = (RenderableBatch *)operator_new(0x90);
  memset(object,0,0x90);
  (object->super_Renderable)._vptr_Renderable = (_func_int **)&PTR__Renderable_00296770;
  this_00 = &(object->super_Renderable).color;
  Color::Color(this_00);
  Vec2::Vec2(&(object->super_Renderable).position);
  (object->super_Renderable).programs.
  super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (object->super_Renderable).programs.
  super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (object->super_Renderable).programs.
  super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (object->super_Renderable)._vptr_Renderable = (_func_int **)&PTR__Renderable_002967a0;
  local_50 = this_00;
  Vec2::Vec2(&object->origSize);
  Vec2::Vec2(&object->size);
  Vec2::Vec2(&object->origin);
  this_01 = &object->region;
  Rect::Rect(this_01);
  Vec2::Vec2(&object->scale);
  object->objectId = this->objectId;
  *(Vec2 *)&(object->origSize).x = this->size;
  (object->size).x = local_38;
  (object->size).y = local_34;
  object->orig = this;
  (object->super_Renderable).position.x = local_3c;
  (object->super_Renderable).position.y = local_40;
  object->angle = local_44;
  object->smooth = this->smooth;
  Vec2::Vec2(&local_58,0.0,0.0);
  object->origin = local_58;
  (object->super_Renderable).function = drawBatch;
  *local_50 = currentColor;
  fVar1 = (this->region).y;
  fVar3 = (this->region).w;
  fVar2 = (this->region).h;
  this_01->x = (this->region).x;
  this_01->y = fVar1;
  (object->region).w = fVar3;
  (object->region).h = fVar2;
  object->scale = this->scale;
  addRenderList((Renderable *)object);
  return object;
}

Assistant:

RenderableBatch *nite::Batch::draw(float x, float y, float angle){
	if(objectId <= -1) return NULL;
	float rw = size.x;
	float rh = size.y;
	if(region.w != size.x || region.h != size.y){
		rw = region.w;
		rh = region.h;
	}
	nite::RenderableBatch *obj = new nite::RenderableBatch();
	obj->objectId = objectId;
	obj->origSize = size;
	obj->size.x = rw;
	obj->size.y	= rh;
	obj->orig = this;
	obj->position.x = x;
	obj->position.y = y;
	obj->angle = angle;
	obj->smooth = smooth;
	obj->origin = nite::Vec2(0, 0);
	obj->function = &drawBatch;
	obj->color = nite::getColor();
	obj->region	= region;
	obj->scale = scale;
	nite::addRenderList((nite::Renderable*)obj);
	return obj;
}